

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_5,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  float *pfVar6;
  float *pfVar7;
  bool bVar8;
  float *pfVar9;
  long lVar10;
  float v;
  float fVar11;
  float local_78 [5];
  float local_64 [3];
  Matrix<float,_2,_2> res;
  float local_48 [4];
  Type in0;
  Type in1;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    res.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
    res.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    res.m_data.m_data[1].m_data[0] = (float)uVar1;
    res.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    res.m_data.m_data[0].m_data[0] = -0.1;
    res.m_data.m_data[0].m_data[1] = -0.2;
    res.m_data.m_data[1].m_data[0] = 1.0;
    res.m_data.m_data[1].m_data[1] = 0.0;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_48[0] = evalCtx->in[0].m_data[0];
    local_48[1] = evalCtx->in[0].m_data[1];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_48[2] = (float)uVar1;
    local_48[3] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    local_48[0] = 0.8;
    local_48[1] = 0.5;
    local_48[2] = 0.1;
    local_48[3] = -0.9;
  }
  local_78[0] = 1.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 1.0;
  pfVar6 = local_78;
  pfVar7 = (float *)&res;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    lVar3 = 0;
    pfVar9 = local_48;
    bVar2 = true;
    do {
      bVar8 = bVar2;
      fVar11 = 0.0;
      lVar10 = 0;
      bVar2 = true;
      do {
        bVar4 = bVar2;
        fVar11 = fVar11 + pfVar7[lVar10 * 2] * pfVar9[lVar10];
        lVar10 = 1;
        bVar2 = false;
      } while (bVar4);
      pfVar6[lVar3 * 2] = fVar11;
      lVar3 = 1;
      pfVar9 = local_48 + 2;
      bVar2 = false;
    } while (bVar8);
    pfVar6 = local_78 + 1;
    pfVar7 = res.m_data.m_data[0].m_data + 1;
    bVar2 = false;
  } while (bVar5);
  local_64[0] = local_78[0];
  local_64[1] = local_78[2];
  local_64[2] = local_78[1] + local_78[3];
  in0.m_data.m_data[1].m_data[0] = 0.0;
  in0.m_data.m_data[1].m_data[1] = 1.4013e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)in0.m_data.m_data[0].m_data[lVar3]] = local_78[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}